

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

void lj_mcode_free(jit_State *J)

{
  MCode *pMVar1;
  size_t sz_00;
  size_t sz;
  MCode *next;
  MCode *mc;
  jit_State *J_local;
  
  next = J->mcarea;
  J->mcarea = (MCode *)0x0;
  J->szallmcarea = 0;
  while (next != (MCode *)0x0) {
    pMVar1 = *(MCode **)next;
    sz_00 = *(size_t *)(next + 8);
    lj_err_deregister_mcode(next,sz_00,next + 0x10);
    mcode_free(J,next,sz_00);
    next = pMVar1;
  }
  return;
}

Assistant:

void lj_mcode_free(jit_State *J)
{
  MCode *mc = J->mcarea;
  J->mcarea = NULL;
  J->szallmcarea = 0;
  while (mc) {
    MCode *next = ((MCLink *)mc)->next;
    size_t sz = ((MCLink *)mc)->size;
    lj_err_deregister_mcode(mc, sz, (uint8_t *)mc + sizeof(MCLink));
    mcode_free(J, mc, sz);
    mc = next;
  }
}